

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool initExtensions(void)

{
  int iVar1;
  int local_14;
  long lStack_10;
  int supported;
  XRRScreenResources *sr;
  
  _glfw.x11.vidmode.available = XF86VidModeQueryExtension(_glfw.x11.display,0x136354,0x136358);
  iVar1 = XRRQueryExtension(_glfw.x11.display,0x1362dc,0x1362e0);
  if (iVar1 != 0) {
    iVar1 = XRRQueryVersion(_glfw.x11.display,0x1362e4,0x1362e8);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"X11: Failed to query RandR version");
    }
    else if ((1 < _glfw.x11.randr.major) || (2 < _glfw.x11.randr.minor)) {
      _glfw.x11.randr.available = 1;
    }
  }
  if (_glfw.x11.randr.available != 0) {
    lStack_10 = XRRGetScreenResources(_glfw.x11.display,_glfw.x11.root);
    if ((*(int *)(lStack_10 + 0x10) == 0) ||
       (iVar1 = XRRGetCrtcGammaSize(_glfw.x11.display,**(undefined8 **)(lStack_10 + 0x18)),
       iVar1 == 0)) {
      _glfwInputError(0x10008,"X11: RandR gamma ramp support seems broken");
      _glfw.x11.randr.gammaBroken = 1;
    }
    XRRFreeScreenResources(lStack_10);
    XRRSelectInput(_glfw.x11.display,_glfw.x11.root,4);
  }
  iVar1 = XineramaQueryExtension(_glfw.x11.display,0x136334,0x136338);
  if ((iVar1 != 0) && (iVar1 = XineramaIsActive(_glfw.x11.display), iVar1 != 0)) {
    _glfw.x11.xinerama.available = 1;
  }
  _glfw.x11.xkb.major = 1;
  _glfw.x11.xkb.minor = 0;
  _glfw.x11.xkb.available =
       XkbQueryExtension(_glfw.x11.display,0x1362fc,0x136300,0x136304,0x136308,0x13630c);
  if (((_glfw.x11.xkb.available != 0) &&
      (iVar1 = XkbSetDetectableAutoRepeat(_glfw.x11.display,1,&local_14), iVar1 != 0)) &&
     (local_14 != 0)) {
    _glfw.x11.xkb.detectable = 1;
  }
  _glfw.x11.x11xcb.handle = (void *)dlopen("libX11-xcb.so",0x101);
  if (_glfw.x11.x11xcb.handle != (void *)0x0) {
    _glfw.x11.x11xcb.XGetXCBConnection =
         (XGETXCBCONNECTION_T)dlsym(_glfw.x11.x11xcb.handle,"XGetXCBConnection");
  }
  createKeyTables();
  detectEWMH();
  _glfw.x11.NULL_ = XInternAtom(_glfw.x11.display,"NULL",0);
  _glfw.x11.UTF8_STRING = XInternAtom(_glfw.x11.display,"UTF8_STRING",0);
  _glfw.x11.COMPOUND_STRING = XInternAtom(_glfw.x11.display,"COMPOUND_STRING",0);
  _glfw.x11.ATOM_PAIR = XInternAtom(_glfw.x11.display,"ATOM_PAIR",0);
  _glfw.x11.GLFW_SELECTION = XInternAtom(_glfw.x11.display,"GLFW_SELECTION",0);
  _glfw.x11.TARGETS = XInternAtom(_glfw.x11.display,"TARGETS",0);
  _glfw.x11.MULTIPLE = XInternAtom(_glfw.x11.display,"MULTIPLE",0);
  _glfw.x11.CLIPBOARD = XInternAtom(_glfw.x11.display,"CLIPBOARD",0);
  _glfw.x11.CLIPBOARD_MANAGER = XInternAtom(_glfw.x11.display,"CLIPBOARD_MANAGER",0);
  _glfw.x11.SAVE_TARGETS = XInternAtom(_glfw.x11.display,"SAVE_TARGETS",0);
  _glfw.x11.XdndAware = XInternAtom(_glfw.x11.display,"XdndAware",0);
  _glfw.x11.XdndEnter = XInternAtom(_glfw.x11.display,"XdndEnter",0);
  _glfw.x11.XdndPosition = XInternAtom(_glfw.x11.display,"XdndPosition",0);
  _glfw.x11.XdndStatus = XInternAtom(_glfw.x11.display,"XdndStatus",0);
  _glfw.x11.XdndActionCopy = XInternAtom(_glfw.x11.display,"XdndActionCopy",0);
  _glfw.x11.XdndDrop = XInternAtom(_glfw.x11.display,"XdndDrop",0);
  _glfw.x11.XdndLeave = XInternAtom(_glfw.x11.display,"XdndLeave",0);
  _glfw.x11.XdndFinished = XInternAtom(_glfw.x11.display,"XdndFinished",0);
  _glfw.x11.XdndSelection = XInternAtom(_glfw.x11.display,"XdndSelection",0);
  _glfw.x11.WM_PROTOCOLS = XInternAtom(_glfw.x11.display,"WM_PROTOCOLS",0);
  _glfw.x11.WM_STATE = XInternAtom(_glfw.x11.display,"WM_STATE",0);
  _glfw.x11.WM_DELETE_WINDOW = XInternAtom(_glfw.x11.display,"WM_DELETE_WINDOW",0);
  _glfw.x11.NET_WM_ICON = XInternAtom(_glfw.x11.display,"_NET_WM_ICON",0);
  _glfw.x11.NET_WM_PING = XInternAtom(_glfw.x11.display,"_NET_WM_PING",0);
  _glfw.x11.NET_WM_PID = XInternAtom(_glfw.x11.display,"_NET_WM_PID",0);
  _glfw.x11.NET_WM_NAME = XInternAtom(_glfw.x11.display,"_NET_WM_NAME",0);
  _glfw.x11.NET_WM_ICON_NAME = XInternAtom(_glfw.x11.display,"_NET_WM_ICON_NAME",0);
  _glfw.x11.NET_WM_BYPASS_COMPOSITOR = XInternAtom(_glfw.x11.display,"_NET_WM_BYPASS_COMPOSITOR",0);
  _glfw.x11.MOTIF_WM_HINTS = XInternAtom(_glfw.x11.display,"_MOTIF_WM_HINTS",0);
  return 1;
}

Assistant:

static GLFWbool initExtensions(void)
{
#if defined(_GLFW_HAS_XF86VM)
    // Check for XF86VidMode extension
    _glfw.x11.vidmode.available =
        XF86VidModeQueryExtension(_glfw.x11.display,
                                  &_glfw.x11.vidmode.eventBase,
                                  &_glfw.x11.vidmode.errorBase);
#endif /*_GLFW_HAS_XF86VM*/

    // Check for RandR extension
    if (XRRQueryExtension(_glfw.x11.display,
                          &_glfw.x11.randr.eventBase,
                          &_glfw.x11.randr.errorBase))
    {
        if (XRRQueryVersion(_glfw.x11.display,
                            &_glfw.x11.randr.major,
                            &_glfw.x11.randr.minor))
        {
            // The GLFW RandR path requires at least version 1.3
            if (_glfw.x11.randr.major > 1 || _glfw.x11.randr.minor >= 3)
                _glfw.x11.randr.available = GLFW_TRUE;
        }
        else
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "X11: Failed to query RandR version");
        }
    }

    if (_glfw.x11.randr.available)
    {
        XRRScreenResources* sr = XRRGetScreenResources(_glfw.x11.display,
                                                       _glfw.x11.root);

        if (!sr->ncrtc || !XRRGetCrtcGammaSize(_glfw.x11.display, sr->crtcs[0]))
        {
            // This is either a headless system or an older Nvidia binary driver
            // with broken gamma support
            // Flag it as useless and fall back to Xf86VidMode gamma, if
            // available
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "X11: RandR gamma ramp support seems broken");
            _glfw.x11.randr.gammaBroken = GLFW_TRUE;
        }

        XRRFreeScreenResources(sr);

        XRRSelectInput(_glfw.x11.display, _glfw.x11.root,
                       RROutputChangeNotifyMask);
    }

    if (XineramaQueryExtension(_glfw.x11.display,
                               &_glfw.x11.xinerama.major,
                               &_glfw.x11.xinerama.minor))
    {
        if (XineramaIsActive(_glfw.x11.display))
            _glfw.x11.xinerama.available = GLFW_TRUE;
    }

    // Check if Xkb is supported on this display
    _glfw.x11.xkb.major = 1;
    _glfw.x11.xkb.minor = 0;
    _glfw.x11.xkb.available =
        XkbQueryExtension(_glfw.x11.display,
                          &_glfw.x11.xkb.majorOpcode,
                          &_glfw.x11.xkb.eventBase,
                          &_glfw.x11.xkb.errorBase,
                          &_glfw.x11.xkb.major,
                          &_glfw.x11.xkb.minor);

    if (_glfw.x11.xkb.available)
    {
        Bool supported;

        if (XkbSetDetectableAutoRepeat(_glfw.x11.display, True, &supported))
        {
            if (supported)
                _glfw.x11.xkb.detectable = GLFW_TRUE;
        }
    }

    _glfw.x11.x11xcb.handle = dlopen("libX11-xcb.so", RTLD_LAZY | RTLD_GLOBAL);
    if (_glfw.x11.x11xcb.handle)
    {
        _glfw.x11.x11xcb.XGetXCBConnection = (XGETXCBCONNECTION_T)
            dlsym(_glfw.x11.x11xcb.handle, "XGetXCBConnection");
    }

    // Update the key code LUT
    // FIXME: We should listen to XkbMapNotify events to track changes to
    // the keyboard mapping.
    createKeyTables();

    // Detect whether an EWMH-conformant window manager is running
    detectEWMH();

    // String format atoms
    _glfw.x11.NULL_ = XInternAtom(_glfw.x11.display, "NULL", False);
    _glfw.x11.UTF8_STRING =
        XInternAtom(_glfw.x11.display, "UTF8_STRING", False);
    _glfw.x11.COMPOUND_STRING =
        XInternAtom(_glfw.x11.display, "COMPOUND_STRING", False);
    _glfw.x11.ATOM_PAIR = XInternAtom(_glfw.x11.display, "ATOM_PAIR", False);

    // Custom selection property atom
    _glfw.x11.GLFW_SELECTION =
        XInternAtom(_glfw.x11.display, "GLFW_SELECTION", False);

    // ICCCM standard clipboard atoms
    _glfw.x11.TARGETS = XInternAtom(_glfw.x11.display, "TARGETS", False);
    _glfw.x11.MULTIPLE = XInternAtom(_glfw.x11.display, "MULTIPLE", False);
    _glfw.x11.CLIPBOARD = XInternAtom(_glfw.x11.display, "CLIPBOARD", False);

    // Clipboard manager atoms
    _glfw.x11.CLIPBOARD_MANAGER =
        XInternAtom(_glfw.x11.display, "CLIPBOARD_MANAGER", False);
    _glfw.x11.SAVE_TARGETS =
        XInternAtom(_glfw.x11.display, "SAVE_TARGETS", False);

    // Xdnd (drag and drop) atoms
    _glfw.x11.XdndAware = XInternAtom(_glfw.x11.display, "XdndAware", False);
    _glfw.x11.XdndEnter = XInternAtom(_glfw.x11.display, "XdndEnter", False);
    _glfw.x11.XdndPosition = XInternAtom(_glfw.x11.display, "XdndPosition", False);
    _glfw.x11.XdndStatus = XInternAtom(_glfw.x11.display, "XdndStatus", False);
    _glfw.x11.XdndActionCopy = XInternAtom(_glfw.x11.display, "XdndActionCopy", False);
    _glfw.x11.XdndDrop = XInternAtom(_glfw.x11.display, "XdndDrop", False);
    _glfw.x11.XdndLeave = XInternAtom(_glfw.x11.display, "XdndLeave", False);
    _glfw.x11.XdndFinished = XInternAtom(_glfw.x11.display, "XdndFinished", False);
    _glfw.x11.XdndSelection = XInternAtom(_glfw.x11.display, "XdndSelection", False);

    // ICCCM, EWMH and Motif window property atoms
    // These can be set safely even without WM support
    // The EWMH atoms that require WM support are handled in detectEWMH
    _glfw.x11.WM_PROTOCOLS =
        XInternAtom(_glfw.x11.display, "WM_PROTOCOLS", False);
    _glfw.x11.WM_STATE =
        XInternAtom(_glfw.x11.display, "WM_STATE", False);
    _glfw.x11.WM_DELETE_WINDOW =
        XInternAtom(_glfw.x11.display, "WM_DELETE_WINDOW", False);
    _glfw.x11.NET_WM_ICON =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON", False);
    _glfw.x11.NET_WM_PING =
        XInternAtom(_glfw.x11.display, "_NET_WM_PING", False);
    _glfw.x11.NET_WM_PID =
        XInternAtom(_glfw.x11.display, "_NET_WM_PID", False);
    _glfw.x11.NET_WM_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_NAME", False);
    _glfw.x11.NET_WM_ICON_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON_NAME", False);
    _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
        XInternAtom(_glfw.x11.display, "_NET_WM_BYPASS_COMPOSITOR", False);
    _glfw.x11.MOTIF_WM_HINTS =
        XInternAtom(_glfw.x11.display, "_MOTIF_WM_HINTS", False);

    return GLFW_TRUE;
}